

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *suffix;
  cmState *pcVar6;
  string notfound;
  string library;
  string local_c8;
  long *local_a8 [2];
  long local_98 [2];
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).VariableDocumentation,0,
             (char *)(this->super_cmFindBase).VariableDocumentation._M_string_length,0x52a45a);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,0,
             (char *)(this->super_cmFindBase).super_cmFindCommon.CMakePathName._M_string_length,
             0x53eb80);
  iVar5 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand._vptr_cmCommand[7])
                    (this,argsIn);
  bVar3 = SUB41(iVar5,0);
  if (bVar3 == false) {
    return false;
  }
  if ((this->super_cmFindBase).AlreadyInCache == true) {
    if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo != true) {
      return bVar3;
    }
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
               &(this->super_cmFindBase).VariableName,"",
               (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
    return bVar3;
  }
  this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX","");
  suffix = cmMakefile::GetDefinition(this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (suffix == (char *)0x0) {
    bVar4 = cmMakefile::PlatformIs32Bit
                      ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
    if (bVar4) {
      pcVar6 = cmMakefile::GetState
                         ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"FIND_LIBRARY_USE_LIB32_PATHS","");
      bVar4 = cmState::GetGlobalPropertyAsBool(pcVar6,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4 == false) {
      bVar4 = cmMakefile::PlatformIs64Bit
                        ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      if (bVar4) {
        pcVar6 = cmMakefile::GetState
                           ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"FIND_LIBRARY_USE_LIB64_PATHS","");
        bVar4 = cmState::GetGlobalPropertyAsBool(pcVar6,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4 == false) {
        bVar4 = cmMakefile::PlatformIsx32
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
        if (bVar4) {
          pcVar6 = cmMakefile::GetState
                             ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"FIND_LIBRARY_USE_LIBX32_PATHS","");
          bVar4 = cmState::GetGlobalPropertyAsBool(pcVar6,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar4 = false;
        }
        if (bVar4 == false) goto LAB_001fa3ec;
        suffix = "x32";
      }
      else {
        suffix = "64";
      }
    }
    else {
      suffix = "32";
    }
  }
  AddArchitecturePaths(this,suffix);
LAB_001fa3ec:
  FindLibrary_abi_cxx11_(&local_48,this);
  name = &(this->super_cmFindBase).VariableName;
  if (local_48._M_string_length == 0) {
    pcVar2 = (this->super_cmFindBase).VariableName._M_dataplus._M_p;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar2,
               pcVar2 + (this->super_cmFindBase).VariableName._M_string_length);
    std::__cxx11::string::append((char *)local_a8);
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,name,
               (char *)local_a8[0],(this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
               FILEPATH,false);
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
  }
  else {
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,name,
               local_48._M_dataplus._M_p,
               (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmFindLibraryCommand::InitialPass(std::vector<std::string> const& argsIn,
                                       cmExecutionStatus&)
{
  this->VariableDocumentation = "Path to a library.";
  this->CMakePathName = "LIBRARY";
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  if (this->AlreadyInCache) {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->AlreadyInCacheWithoutMetaInfo) {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmStateEnums::FILEPATH);
    }
    return true;
  }

  // add custom lib<qual> paths instead of using fixed lib32, lib64 or
  // libx32
  if (const char* customLib = this->Makefile->GetDefinition(
        "CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX")) {
    this->AddArchitecturePaths(customLib);
  }
  // add special 32 bit paths if this is a 32 bit compile.
  else if (this->Makefile->PlatformIs32Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB32_PATHS")) {
    this->AddArchitecturePaths("32");
  }
  // add special 64 bit paths if this is a 64 bit compile.
  else if (this->Makefile->PlatformIs64Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB64_PATHS")) {
    this->AddArchitecturePaths("64");
  }
  // add special 32 bit paths if this is an x32 compile.
  else if (this->Makefile->PlatformIsx32() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIBX32_PATHS")) {
    this->AddArchitecturePaths("x32");
  }

  std::string const library = this->FindLibrary();
  if (!library.empty()) {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName, library.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmStateEnums::FILEPATH);
    return true;
  }
  std::string notfound = this->VariableName + "-NOTFOUND";
  this->Makefile->AddCacheDefinition(this->VariableName, notfound.c_str(),
                                     this->VariableDocumentation.c_str(),
                                     cmStateEnums::FILEPATH);
  return true;
}